

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void act_var_rescale(sat_solver *s)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  puVar1 = s->activity;
  for (lVar4 = 0; lVar4 < s->size; lVar4 = lVar4 + 1) {
    puVar1[lVar4] = puVar1[lVar4] >> 0x13;
  }
  iVar2 = s->var_inc >> 0x13;
  iVar3 = 0x10;
  if (0x10 < iVar2) {
    iVar3 = iVar2;
  }
  s->var_inc = iVar3;
  return;
}

Assistant:

static inline void act_var_rescale(sat_solver* s) {
    unsigned* activity = s->activity;
    int i;
    for (i = 0; i < s->size; i++)
        activity[i] >>= 19;
    s->var_inc >>= 19;
    s->var_inc = Abc_MaxInt( s->var_inc, (1<<4) );
}